

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

bool __thiscall smf::MidiMessage::isNoteOff(MidiMessage *this)

{
  size_type sVar1;
  byte *pbVar2;
  const_reference pvVar3;
  MidiMessage *this_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  if (sVar1 == 3) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
    if ((*pbVar2 & 0xf0) == 0x80) {
      this_local._7_1_ = true;
    }
    else {
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
      if (((*pbVar2 & 0xf0) == 0x90) &&
         (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2),
         *pvVar3 == '\0')) {
        return true;
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MidiMessage::isNoteOff(void) const {
	if (size() != 3) {
		return false;
	} else if (((*this)[0] & 0xf0) == 0x80) {
		return true;
	} else if ((((*this)[0] & 0xf0) == 0x90) && ((*this)[2] == 0)) {
		return true;
	} else {
		return false;
	}
}